

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_adaptor.cpp
# Opt level: O2

void __thiscall
nivalis::ImGuiDrawListGraphicsAdaptor::polyline
          (ImGuiDrawListGraphicsAdaptor *this,
          vector<nivalis::point,_std::allocator<nivalis::point>_> *points,color *c,float thickness,
          bool closed,bool fill)

{
  pointer ppVar1;
  point *points_00;
  ImDrawList *pIVar2;
  long lVar3;
  long lVar4;
  vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *this_00;
  ImU32 IVar5;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *extraout_RDX;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *poly_00;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *extraout_RDX_00;
  undefined7 in_register_00000081;
  size_t t;
  ulong uVar6;
  point *p;
  pointer ppVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  ImVec4 local_70;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  poly;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  if ((int)CONCAT71(in_register_00000081,fill) == 0) {
    pIVar2 = this->draw_list;
    points_00 = (points->super__Vector_base<nivalis::point,_std::allocator<nivalis::point>_>).
                _M_impl.super__Vector_impl_data._M_start;
    ppVar7 = (points->super__Vector_base<nivalis::point,_std::allocator<nivalis::point>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    poly.
    super__Vector_base<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = *c->r;
    poly.
    super__Vector_base<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = *c->g;
    poly.
    super__Vector_base<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = *c->b;
    poly.
    super__Vector_base<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = *c->a;
    IVar5 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)&poly);
    ImDrawList::AddPolyline<nivalis::point>
              (pIVar2,points_00,(int)(((long)ppVar7 - (long)points_00) / 0x18),IVar5,closed,
               thickness);
  }
  else {
    std::
    vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
    ::vector(&poly,1,(allocator_type *)&indices);
    ppVar1 = (points->super__Vector_base<nivalis::point,_std::allocator<nivalis::point>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    poly_00 = extraout_RDX;
    for (ppVar7 = (points->super__Vector_base<nivalis::point,_std::allocator<nivalis::point>_>).
                  _M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar1; ppVar7 = ppVar7 + 1) {
      this_00 = (vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *)
                CONCAT44(poly.
                         super__Vector_base<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         poly.
                         super__Vector_base<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_);
      indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = point::operator[](ppVar7,0);
      indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = point::operator[](ppVar7,1);
      std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>::
      emplace_back<std::array<float,2ul>>(this_00,(array<float,_2UL> *)&indices);
      poly_00 = extraout_RDX_00;
    }
    mapbox::
    earcut<unsigned_int,std::vector<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>,std::allocator<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>>>
              (&indices,(mapbox *)&poly,poly_00);
    for (uVar6 = 0;
        lVar4 = CONCAT44(indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                         indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._0_4_),
        uVar6 < (ulong)((long)indices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - lVar4 >> 2);
        uVar6 = uVar6 + 3) {
      pIVar2 = this->draw_list;
      lVar3 = *(long *)CONCAT44(poly.
                                super__Vector_base<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                poly.
                                super__Vector_base<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_);
      local_38 = *(ImVec2 *)(lVar3 + (ulong)*(uint *)(lVar4 + uVar6 * 4) * 8);
      local_40 = *(ImVec2 *)(lVar3 + (ulong)*(uint *)(lVar4 + 4 + uVar6 * 4) * 8);
      local_48 = *(ImVec2 *)(lVar3 + (ulong)*(uint *)(lVar4 + 8 + uVar6 * 4) * 8);
      local_70.x = *c->r;
      local_70.y = *c->g;
      local_70.z = *c->b;
      local_70.w = *c->a;
      IVar5 = ImGui::ColorConvertFloat4ToU32(&local_70);
      ImDrawList::AddTriangleFilled(pIVar2,&local_38,&local_40,&local_48,IVar5);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::
    vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
    ::~vector(&poly);
  }
  return;
}

Assistant:

void ImGuiDrawListGraphicsAdaptor::polyline(const std::vector<point>& points,
                                            const color::color& c,
                                            float thickness, bool closed,
                                            bool fill) {
    if (fill) {
        std::vector<std::vector<ECPoint>> poly(1);
        for (auto& p : points) poly[0].push_back({p[0], p[1]});
        std::vector<ECInt> indices = mapbox::earcut<ECInt>(poly);
        for (size_t t = 0; t < indices.size(); t += 3) {
            const auto i = indices[t], j = indices[t + 1], k = indices[t + 2];
            draw_list->AddTriangleFilled(ImVec2(poly[0][i][0], poly[0][i][1]),
                                         ImVec2(poly[0][j][0], poly[0][j][1]),
                                         ImVec2(poly[0][k][0], poly[0][k][1]),
                                         ImColor(c.r, c.g, c.b, c.a));
        }
    } else {
        draw_list->AddPolyline<point>(&points[0], points.size(),
                                      ImColor(c.r, c.g, c.b, c.a), closed,
                                      thickness);
    }
}